

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

int __thiscall testing::UnitTest::total_test_count(UnitTest *this)

{
  int iVar1;
  
  iVar1 = internal::UnitTestImpl::total_test_count(this->impl_);
  return iVar1;
}

Assistant:

const internal::UnitTestImpl* impl() const { return impl_; }